

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

TStatus luaE_resetthread(lua_State *L,TStatus status)

{
  TStatus TVar1;
  long lVar2;
  undefined7 in_register_00000031;
  
  resetCI(L);
  TVar1 = '\0';
  if ((int)CONCAT71(in_register_00000031,status) != 1) {
    TVar1 = status;
  }
  TVar1 = luaD_closeprotected(L,1,TVar1);
  lVar2 = (L->stack).offset;
  if (TVar1 == '\0') {
    (L->top).p = (StkId)(lVar2 + 0x10);
  }
  else {
    luaD_seterrorobj(L,TVar1,(StkId)(lVar2 + 0x10));
    lVar2 = (L->stack).offset;
  }
  luaD_reallocstack(L,(int)((ulong)((long)(L->ci->top).p - lVar2) >> 4),0);
  return TVar1;
}

Assistant:

TStatus luaE_resetthread (lua_State *L, TStatus status) {
  resetCI(L);
  if (status == LUA_YIELD)
    status = LUA_OK;
  status = luaD_closeprotected(L, 1, status);
  if (status != LUA_OK)  /* errors? */
    luaD_seterrorobj(L, status, L->stack.p + 1);
  else
    L->top.p = L->stack.p + 1;
  luaD_reallocstack(L, cast_int(L->ci->top.p - L->stack.p), 0);
  return status;
}